

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  setDocumentLocatorSAXFunc p_Var6;
  startDocumentSAXFunc p_Var7;
  charactersSAXFunc p_Var8;
  __int32_t *p_Var9;
  endDocumentSAXFunc p_Var10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  __int32_t **pp_Var15;
  xmlDtdPtr pxVar16;
  uint uVar17;
  undefined8 in_R8;
  size_t extraLen;
  
  iVar12 = 0x73;
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (pxVar3 = ctxt->input, pxVar3 != (xmlParserInputPtr)0x0))
  {
    if ((-1 < size && pxVar3->buf != (xmlParserInputBufferPtr)0x0) &&
       (extraLen = CONCAT71((int7)((ulong)in_R8 >> 8),0 < size), chunk != (char *)0x0 || 0 >= size))
    {
      if (ctxt->disableSAX < 2) {
        if (0 < size) {
          pxVar4 = pxVar3->cur;
          pxVar5 = pxVar3->base;
          iVar12 = xmlParserInputBufferPush(pxVar3->buf,size,chunk);
          xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar4 - (long)pxVar5);
          if (iVar12 < 0) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_HTML,ctxt->input->buf->error,XML_ERR_ERROR,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,
                       "xmlParserInputBufferPush failed",0,0);
            xmlHaltParser(ctxt);
            return ctxt->errNo;
          }
        }
        do {
          if (1 < ctxt->disableSAX) break;
          pxVar3 = ctxt->input;
          iVar12 = 3;
          if (pxVar3 == (xmlParserInputPtr)0x0) goto switchD_00169460_caseD_ffffffff;
          if (0x12 < (uint)(ctxt->instate + XML_PARSER_MISC)) {
switchD_00169460_caseD_2:
            extraLen = 2;
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_HTML,XML_ERR_INTERNAL_ERROR,XML_ERR_ERROR,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"HPP: internal error\n",0,0);
            ctxt->instate = XML_PARSER_EOF;
            goto LAB_001695fa;
          }
          uVar14 = (long)pxVar3->end - (long)pxVar3->cur;
          switch(ctxt->instate) {
          case XML_PARSER_START:
            if ((terminate != 0) || (3 < uVar14)) {
              xmlDetectEncoding(ctxt);
              if (((ctxt->input->flags & 1) == 0) &&
                 (iVar12 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar12 == 0)) {
                xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
              }
              goto switchD_00169460_caseD_11;
            }
            break;
          case XML_PARSER_MISC:
          case XML_PARSER_PROLOG:
            htmlSkipBlankChars(ctxt);
            uVar14 = (long)pxVar3->end - (long)pxVar3->cur;
          case XML_PARSER_CONTENT:
            iVar12 = 1;
            if (uVar14 != 0) {
              if (ctxt->endCheckState == 0) {
                pxVar4 = pxVar3->cur;
                if (*pxVar4 != '<') {
                  ctxt->instate = XML_PARSER_CONTENT;
                  if (((terminate == 0) && (uVar14 < 1000)) &&
                     (iVar13 = htmlParseLookupString(ctxt,0,"<",1,extraLen), iVar13 < 0))
                  goto LAB_0016949f;
                  ctxt->checkIndex = 0;
                  goto LAB_0016948a;
                }
                if (uVar14 == 1) {
                  uVar17 = 0x20;
                  if (terminate != 0) goto LAB_00169670;
                  goto LAB_0016988a;
                }
                uVar17 = (uint)pxVar4[1];
LAB_00169670:
                if (uVar17 == 0x3f) {
                  if ((terminate == 0) &&
                     (iVar12 = htmlParseLookupString(ctxt,2,">",1,extraLen), iVar12 < 0))
                  goto LAB_0016988a;
                  pxVar3 = ctxt->input;
                  ppxVar1 = &pxVar3->cur;
                  *ppxVar1 = *ppxVar1 + 1;
                  piVar2 = &pxVar3->col;
                  *piVar2 = *piVar2 + 1;
LAB_0016971a:
                  htmlParseComment(ctxt,1);
LAB_00169797:
                  iVar12 = 0;
                  bVar11 = true;
                }
                else {
                  if (uVar17 == 0x2f) {
                    ctxt->instate = XML_PARSER_END_TAG;
LAB_0016973e:
                    ctxt->checkIndex = 0;
                    goto LAB_00169797;
                  }
                  if (uVar17 != 0x21) {
                    if (0x19 < (uVar17 | 0x20) - 0x61) {
                      ctxt->instate = XML_PARSER_CONTENT;
                      htmlStartCharData(ctxt);
                      if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
                         (p_Var8 = ctxt->sax->characters, p_Var8 != (charactersSAXFunc)0x0)) {
                        (*p_Var8)(ctxt->userData,"<",1);
                      }
                      pxVar3 = ctxt->input;
                      ppxVar1 = &pxVar3->cur;
                      *ppxVar1 = *ppxVar1 + 1;
                      piVar2 = &pxVar3->col;
                      *piVar2 = *piVar2 + 1;
                      goto LAB_00169797;
                    }
                    ctxt->instate = XML_PARSER_START_TAG;
                    goto LAB_0016973e;
                  }
                  if ((terminate == 0) && (uVar14 < 4)) {
LAB_0016988a:
                    iVar12 = 1;
                    bVar11 = false;
                  }
                  else {
                    if ((pxVar4[2] != '-') || (pxVar4[3] != '-')) {
                      if ((terminate != 0) || (8 < uVar14)) {
                        pp_Var15 = __ctype_toupper_loc();
                        p_Var9 = *pp_Var15;
                        pxVar4 = ctxt->input->cur;
                        if ((p_Var9[pxVar4[2]] == 0x44) &&
                           ((((p_Var9[pxVar4[3]] == 0x4f && (p_Var9[pxVar4[4]] == 0x43)) &&
                             (p_Var9[pxVar4[5]] == 0x54)) &&
                            (((p_Var9[pxVar4[6]] == 0x59 && (p_Var9[pxVar4[7]] == 0x50)) &&
                             (p_Var9[pxVar4[8]] == 0x45)))))) {
                          if ((terminate != 0) ||
                             (iVar12 = htmlParseLookupString(ctxt,9,">",1,extraLen), -1 < iVar12)) {
                            htmlParseDocTypeDecl(ctxt);
                            if (ctxt->instate == XML_PARSER_MISC) {
                              ctxt->instate = XML_PARSER_PROLOG;
                            }
                            else {
                              ctxt->instate = XML_PARSER_CONTENT;
                            }
                            goto LAB_00169797;
                          }
                        }
                        else {
                          ctxt->instate = XML_PARSER_CONTENT;
                          if ((terminate != 0) ||
                             (iVar12 = htmlParseLookupString(ctxt,2,">",1,extraLen), -1 < iVar12)) {
                            pxVar3 = ctxt->input;
                            ppxVar1 = &pxVar3->cur;
                            *ppxVar1 = *ppxVar1 + 2;
                            piVar2 = &pxVar3->col;
                            *piVar2 = *piVar2 + 2;
                            goto LAB_0016971a;
                          }
                        }
                      }
                      goto LAB_0016988a;
                    }
                    if ((terminate == 0) && (iVar12 = htmlParseLookupCommentEnd(ctxt), iVar12 < 0))
                    goto LAB_0016988a;
                    pxVar3 = ctxt->input;
                    ppxVar1 = &pxVar3->cur;
                    *ppxVar1 = *ppxVar1 + 4;
                    piVar2 = &pxVar3->col;
                    *piVar2 = *piVar2 + 4;
                    bVar11 = false;
                    htmlParseComment(ctxt,0);
                    iVar12 = 4;
                  }
                }
                if (!bVar11) goto LAB_0016949f;
              }
              else {
LAB_0016948a:
                iVar13 = htmlParseCharData(ctxt,(uint)(terminate == 0));
                if (iVar13 == 0) goto LAB_0016949f;
              }
              iVar12 = 4;
            }
LAB_0016949f:
            if (iVar12 == 4) {
LAB_001695fa:
              iVar12 = 0;
            }
            break;
          default:
            goto switchD_00169460_caseD_2;
          case XML_PARSER_START_TAG:
            if ((terminate != 0) || (iVar13 = htmlParseLookupGt(ctxt), -1 < iVar13)) {
              htmlParseElementInternal(ctxt);
              ctxt->instate = XML_PARSER_CONTENT;
              goto LAB_001695fa;
            }
            break;
          case XML_PARSER_END_TAG:
            if ((terminate != 0) || (iVar13 = htmlParseLookupGt(ctxt), -1 < iVar13)) {
              htmlParseEndTag(ctxt);
              ctxt->instate = XML_PARSER_CONTENT;
              ctxt->checkIndex = 0;
              goto LAB_001695fa;
            }
            break;
          case XML_PARSER_XML_DECL:
switchD_00169460_caseD_11:
            if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
               (p_Var6 = ctxt->sax->setDocumentLocator, p_Var6 != (setDocumentLocatorSAXFunc)0x0)) {
              (*p_Var6)(ctxt->userData,&xmlDefaultSAXLocator);
            }
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var7 = ctxt->sax->startDocument, p_Var7 != (startDocumentSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              (*p_Var7)(ctxt->userData);
            }
            if ((ctxt->instate == XML_PARSER_XML_DECL) || (ctxt->instate == XML_PARSER_START)) {
              ctxt->instate = XML_PARSER_MISC;
            }
            goto LAB_001695fa;
          case XML_PARSER_EOF:
            break;
          }
switchD_00169460_caseD_ffffffff:
        } while (iVar12 == 0);
        if ((terminate != 0) && (ctxt->instate != XML_PARSER_EOF)) {
          htmlAutoCloseOnEnd(ctxt);
          xmlParserCheckEOF(ctxt,XML_ERR_INTERNAL_ERROR);
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var10 = ctxt->sax->endDocument, p_Var10 != (endDocumentSAXFunc)0x0)) {
            (*p_Var10)(ctxt->userData);
          }
          if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
             (pxVar16 = xmlGetIntSubset(ctxt->myDoc), pxVar16 == (xmlDtdPtr)0x0)) {
            pxVar16 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                         (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                         (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
            ctxt->myDoc->intSubset = pxVar16;
            if (pxVar16 == (xmlDtdPtr)0x0) {
              xmlCtxtErrMemory(ctxt);
            }
          }
          ctxt->instate = XML_PARSER_EOF;
        }
      }
      iVar12 = ctxt->errNo;
    }
  }
  return iVar12;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) ||
        (ctxt->input == NULL) || (ctxt->input->buf == NULL) ||
        (size < 0) ||
        ((size > 0) && (chunk == NULL)))
	return(XML_ERR_ARGUMENT);
    if (PARSER_STOPPED(ctxt) != 0)
        return(ctxt->errNo);

    if (size > 0)  {
	size_t pos = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
	if (res < 0) {
            htmlParseErr(ctxt, ctxt->input->buf->error,
                         "xmlParserInputBufferPush failed", NULL, NULL);
            xmlHaltParser(ctxt);
	    return (ctxt->errNo);
	}
    }

    htmlParseTryOrFinish(ctxt, terminate);

    if ((terminate) && (ctxt->instate != XML_PARSER_EOF)) {
        htmlAutoCloseOnEnd(ctxt);

        /*
         * Only check for truncated multi-byte sequences
         */
        xmlParserCheckEOF(ctxt, XML_ERR_INTERNAL_ERROR);

        if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
            ctxt->sax->endDocument(ctxt->userData);

        if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) &&
            (ctxt->myDoc != NULL)) {
            xmlDtdPtr dtd;
            dtd = xmlGetIntSubset(ctxt->myDoc);
            if (dtd == NULL) {
                ctxt->myDoc->intSubset =
                    xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
                        BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
                        BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
                if (ctxt->myDoc->intSubset == NULL)
                    htmlErrMemory(ctxt);
            }
        }

	ctxt->instate = XML_PARSER_EOF;
    }

    return((xmlParserErrors) ctxt->errNo);
}